

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int css_seas(double *inp,int N,int optmethod,int p,int d,int q,int s,int P,int D,int Q,double *phi,
            double *theta,double *PHI,double *THETA,double *wmean,double *var,double *loglik,
            double *hess)

{
  size_t __size;
  uint N_00;
  uint uVar1;
  double *oup;
  alik_css_seas_object __ptr;
  double *xi;
  double *xf;
  double *col;
  double *dx;
  int *ipiv;
  double *oup_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int N_01;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  undefined1 local_c8 [8];
  custom_function css_min;
  
  uVar4 = (ulong)(uint)N;
  oup = (double *)malloc((long)(N - D * s) << 3);
  __ptr = alik_css_seas_init(p,d,q,s,P,D,Q,N);
  N_00 = __ptr->pq;
  lVar9 = (long)(int)N_00;
  __size = lVar9 * 8;
  xi = (double *)malloc(__size);
  xf = (double *)malloc(__size);
  col = (double *)malloc(__size * lVar9);
  dx = (double *)malloc(__size);
  ipiv = (int *)malloc(lVar9 * 4);
  if (D < 1) {
    uVar6 = 0;
    uVar2 = 0;
    if (0 < N) {
      uVar2 = (ulong)(uint)N;
    }
    for (; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      oup[uVar6] = inp[uVar6];
    }
  }
  else {
    uVar1 = diffs(inp,N,D,s,oup);
    uVar4 = (ulong)uVar1;
  }
  iVar7 = (int)uVar4;
  oup_00 = (double *)malloc((long)(iVar7 - d) << 3);
  css_min.params = oup;
  if (d < 1) {
    uVar2 = 0;
    uVar6 = 0;
    if (0 < iVar7) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      oup_00[uVar2] = oup[uVar2];
    }
  }
  else {
    uVar1 = diff(oup,iVar7,d,oup_00);
    uVar4 = (ulong)uVar1;
  }
  N_01 = (int)uVar4;
  __ptr->N = N_01;
  iVar7 = __ptr->offset;
  uVar2 = 0;
  uVar6 = 0;
  if (0 < p) {
    uVar6 = (ulong)(uint)p;
  }
  for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    xi[uVar2] = 0.0;
  }
  uVar3 = 0;
  uVar2 = 0;
  if (0 < q) {
    uVar2 = (ulong)(uint)q;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    xi[(long)p + uVar3] = 0.0;
  }
  iVar10 = q + p;
  uVar3 = 0;
  uVar8 = 0;
  if (0 < P) {
    uVar8 = (ulong)(uint)P;
  }
  for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    xi[(long)iVar10 + uVar3] = 0.0;
  }
  iVar11 = iVar10 + P;
  uVar3 = 0;
  uVar12 = 0;
  if (0 < Q) {
    uVar12 = (ulong)(uint)Q;
  }
  for (; uVar12 != uVar3; uVar3 = uVar3 + 1) {
    xi[(long)iVar11 + uVar3] = 0.0;
  }
  dVar13 = 0.0;
  if (__ptr->M == 1) {
    dVar13 = mean(oup_00,N_01);
    xi[iVar11 + Q] = dVar13;
  }
  *wmean = dVar13;
  __ptr->mean = dVar13;
  uVar5 = 0;
  uVar3 = 0;
  if (0 < N_01) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    dVar13 = oup_00[uVar5];
    __ptr->x[(long)(iVar7 + N_01 * 2) + uVar5] = dVar13;
    __ptr->x[(long)iVar7 + uVar5] = dVar13;
  }
  for (lVar9 = (long)N_01; lVar9 < N_01 * 2; lVar9 = lVar9 + 1) {
    __ptr->x[iVar7 + lVar9] = 0.0;
  }
  local_c8 = (undefined1  [8])fcss_seas;
  css_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  uVar1 = fminunc((custom_function *)local_c8,(custom_gradient *)0x0,N_00,xi,1.0,optmethod,xf);
  if ((0xf < uVar1) || ((0x8011U >> (uVar1 & 0x1f) & 1) == 0)) {
    uVar1 = 1;
  }
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)N_00) {
    uVar3 = (ulong)N_00;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dx[uVar4] = 1.0;
  }
  hessian_fd((custom_function *)local_c8,xf,N_00,dx,__ptr->eps,hess);
  mtranspose(hess,N_00,N_00,col);
  for (uVar4 = 0; N_00 * N_00 != uVar4; uVar4 = uVar4 + 1) {
    col[uVar4] = (hess[uVar4] + col[uVar4]) * (double)(N_01 - (D * s + d)) * 0.5;
  }
  ludecomp(col,N_00,ipiv);
  minverse(col,N_00,ipiv,hess);
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    phi[uVar4] = xf[uVar4];
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    theta[uVar4] = -xf[(long)p + uVar4];
  }
  for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    PHI[uVar4] = xf[(long)iVar10 + uVar4];
  }
  for (uVar4 = 0; uVar12 != uVar4; uVar4 = uVar4 + 1) {
    THETA[uVar4] = -xf[(long)iVar11 + uVar4];
  }
  dVar13 = 0.0;
  if (__ptr->M == 1) {
    dVar13 = xf[iVar11 + Q];
  }
  *wmean = dVar13;
  *var = __ptr->ssq / (double)N_01;
  *loglik = __ptr->loglik;
  free(xi);
  free(xf);
  free(css_min.params);
  free(oup_00);
  free(col);
  free(dx);
  free(ipiv);
  free(__ptr);
  return uVar1;
}

Assistant:

int css_seas(double *inp, int N, int optmethod, int p, int d, int q, int s, int P, int D, int Q,
	double *phi, double *theta, double *PHI, double *THETA, double *wmean, double *var,double *loglik,double *hess) {
	int i, pq, retval, length, offset,ret;
	double *b, *tf, *x, *inp2,*dx,*thess;
	int *ipiv;
	double maxstep;
	alik_css_seas_object obj;
	//custom_function as154_min;

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	length = N;

	maxstep = 1.0;

	obj = alik_css_seas_init(p, d, q, s, P, D, Q, N);

	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);
	/*

	*/

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	obj->N = N;

	offset = obj->offset;
	// Test

	for (i = 0; i < p; ++i) {
		b[i] = 0.0;
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = 0.0;
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = 0.0;
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = 0.0;
	}

	if (obj->M == 1) {
		b[p + q + P + Q] = mean(x, N);
		*wmean = b[p + q + P + Q];
	}
	else {
		*wmean = 0.0;
	}

	obj->mean = *wmean;

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	custom_function css_min = { fcss_seas, obj };
	retval = fminunc(&css_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	hessian_fd(&css_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (obj->M == 1) {
		*wmean = tf[p + q + Q + P];
	}
	else {
		*wmean = 0.0;
	}
	
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
	wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double)N;
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(inp2);
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	free_alik_css_seas(obj);
	return ret;
}